

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O2

SamProgram * __thiscall
BamTools::SamProgramChain::operator[](SamProgramChain *this,string *programId)

{
  int iVar1;
  long lVar2;
  reference pvVar3;
  BamException *this_00;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  iVar1 = IndexOf(this,programId);
  lVar2 = (long)(this->m_data).
                super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_data).
                super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (iVar1 != (int)(lVar2 / 0xd8)) {
    pvVar3 = std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>::at
                       (&this->m_data,(long)iVar1);
    return pvVar3;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28,0xd8,lVar2 % 0xd8);
  std::__cxx11::string::string((string *)&local_38,"SamProgramChain::operator[]",&local_59);
  std::operator+(&local_58,"unknown programId: ",programId);
  Internal::BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&Internal::BamException::typeinfo,Internal::BamException::~BamException);
}

Assistant:

SamProgram& SamProgramChain::operator[](const std::string& programId)
{

    // look up program record matching this ID
    int index = IndexOf(programId);

    // if record not found
    if (index == (int)m_data.size()) {
        throw Internal::BamException("SamProgramChain::operator[]",
                                     "unknown programId: " + programId);
    }

    // otherwise return program record at index
    return m_data.at(index);
}